

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O0

KBOOL __thiscall KDIS::UTILS::DIS_Logger_Playback::EndOfLogReached(DIS_Logger_Playback *this)

{
  ulong uVar1;
  size_type sVar2;
  DIS_Logger_Playback *this_local;
  
  uVar1 = std::ios::eof();
  if (((uVar1 & 1) == 0) ||
     (sVar2 = std::
              queue<KDIS::UTILS::DIS_Logger_Playback::Log,_std::deque<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>_>
              ::size(&this->m_qLog), sVar2 != 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL DIS_Logger_Playback::EndOfLogReached() const
{
    if( m_File.eof() && m_qLog.size() == 0 )return true;
    return false;
}